

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O1

void visit_keys(node_t node_,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_,
               _func_void_uchar_ptr_size_t_void_ptr *func_,void *arg_)

{
  uint uVar1;
  uchar *puVar2;
  node_t node__00;
  size_t index_;
  ulong uVar3;
  node_t local_38;
  
  uVar3 = (ulong)*(uint *)(node_._data + 4);
  local_38._data = node_._data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (buffer_,(size_type)
                     ((buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish +
                     (uVar3 - (long)(buffer_->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start)));
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (node_._data + 0xc,node_._data + uVar3 + 0xc,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             buffer_);
  if (*(int *)node_._data != 0) {
    if ((buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      visit_keys();
    }
    puVar2 = (buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*func_)(puVar2,(long)(buffer_->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish - (long)puVar2,arg_);
  }
  uVar1 = *(uint *)(node_._data + 8);
  if ((ulong)uVar1 != 0) {
    index_ = 0;
    do {
      node__00 = node_t::node_at(&local_38,index_);
      visit_keys(node__00,buffer_,func_,arg_);
      index_ = index_ + 1;
    } while (uVar1 != index_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (buffer_,(long)(buffer_->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)((buffer_->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar3));
  return;
}

Assistant:

static void
visit_keys (node_t node_,
            std::vector<unsigned char> &buffer_,
            void (*func_) (unsigned char *data_, size_t size_, void *arg_),
            void *arg_)
{
    const size_t prefix_length = node_.prefix_length ();
    buffer_.reserve (buffer_.size () + prefix_length);
    std::copy (node_.prefix (), node_.prefix () + prefix_length,
               std::back_inserter (buffer_));

    if (node_.refcount () > 0) {
        zmq_assert (!buffer_.empty ());
        func_ (&buffer_[0], buffer_.size (), arg_);
    }

    for (size_t i = 0, edgecount = node_.edgecount (); i < edgecount; ++i) {
        visit_keys (node_.node_at (i), buffer_, func_, arg_);
    }
    buffer_.resize (buffer_.size () - prefix_length);
}